

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

string * __thiscall
booster::locale::impl_icu::calendar_impl::get_timezone_abi_cxx11_
          (string *__return_storage_ptr__,calendar_impl *this)

{
  pointer pcVar1;
  long lVar2;
  UnicodeString tz;
  icu_std_converter<char,_1> cvt;
  string local_a8;
  code *local_88;
  undefined2 local_80;
  icu_std_converter<char,_1> local_48;
  
  local_88 = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
  local_80 = 2;
  lVar2 = icu_70::Calendar::getTimeZone();
  icu_70::UnicodeString::operator=((UnicodeString *)&local_88,(UnicodeString *)(lVar2 + 8));
  pcVar1 = (this->encoding_)._M_dataplus._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + (this->encoding_)._M_string_length);
  icu_std_converter<char,_1>::icu_std_converter(&local_48,&local_a8,cvt_skip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  icu_std_converter<char,1>::std_abi_cxx11_
            (__return_storage_ptr__,&local_48,(UnicodeString *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.charset_._M_dataplus._M_p != &local_48.charset_.field_2) {
    operator_delete(local_48.charset_._M_dataplus._M_p);
  }
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string get_timezone() const 
        {
            icu::UnicodeString tz;
            calendar_->getTimeZone().getID(tz);
            icu_std_converter<char> cvt(encoding_);
            return cvt.std(tz);
        }